

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O1

string * de::toUpper(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  locale *plVar4;
  ctype *pcVar5;
  size_type sVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  paVar8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  plVar4 = (locale *)std::locale::classic();
  if (sVar3 != 0) {
    sVar6 = 0;
    do {
      cVar1 = pcVar2[sVar6];
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      (**(code **)(*(long *)pcVar5 + 0x10))(pcVar5,(int)cVar1);
      uVar7 = (long)paVar8 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
      std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,uVar7,0,'\x01');
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((__return_storage_ptr__->_M_dataplus)._M_p + uVar7 + 1);
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string toUpper (const string& str)
{
	string ret;
	std::transform(str.begin(), str.end(), std::inserter(ret, ret.begin()), ToUpper());
	return ret;
}